

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O2

int Extra_ThreshSelectWeights3(word *t,int nVars,int *pW)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  
  if (nVars != 3) {
    __assert_fail("nVars == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddThresh.c"
                  ,0xa3,"int Extra_ThreshSelectWeights3(word *, int, int *)");
  }
  uVar3 = 1;
  do {
    pW[2] = uVar3;
    uVar4 = uVar3;
    if (uVar3 == 4) {
      return 0;
    }
    for (; pW[1] = uVar4, uVar5 = uVar4, uVar4 != 4; uVar4 = uVar4 + 1) {
      for (; *pW = uVar5, uVar5 < 4; uVar5 = uVar5 + 1) {
        uVar6 = 0;
        iVar8 = 10000;
        iVar7 = 0;
        do {
          if ((int)uVar6 == 8) {
            if (iVar7 < iVar8) {
              return iVar8;
            }
            __assert_fail("Lmax < Lmin",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddThresh.c"
                          ,0xb7,"int Extra_ThreshSelectWeights3(word *, int, int *)");
          }
          uVar1 = t[uVar6 >> 6 & 0x3ffffff];
          iVar2 = Extra_ThreshWeightedSum(pW,3,(int)uVar6);
          if ((uVar1 >> (uVar6 & 0x3f) & 1) == 0) {
            if (iVar7 <= iVar2) {
              iVar7 = iVar2;
            }
          }
          else if (iVar2 <= iVar8) {
            iVar8 = iVar2;
          }
          uVar6 = uVar6 + 1;
        } while (iVar7 < iVar8);
      }
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

int Extra_ThreshSelectWeights3(word * t, int nVars, int * pW) {
	int m, Lmin, Lmax, nMints = (1 << nVars);
	assert(nVars == 3);
	for (pW[2] = 1; pW[2] <= nVars; pW[2]++)
		for (pW[1] = pW[2]; pW[1] <= nVars; pW[1]++)
			for (pW[0] = pW[1]; pW[0] <= nVars; pW[0]++) {
				Lmin = 10000;
				Lmax = 0;
				for (m = 0; m < nMints; m++) {
					if (Abc_TtGetBit(t, m))
						Lmin = Abc_MinInt(Lmin,
								Extra_ThreshWeightedSum(pW, nVars, m));
					else
						Lmax = Abc_MaxInt(Lmax,
								Extra_ThreshWeightedSum(pW, nVars, m));
					if (Lmax >= Lmin)
						break;
//            printf( "%c%d ", Abc_TtGetBit(t, m) ? '+' : '-', Extra_ThreshWeightedSum(pW, nVars, m) );
				}
//        printf( "  -%d +%d\n", Lmax, Lmin );
				if (m < nMints)
					continue;
				assert(Lmax < Lmin);
				return Lmin;
			}
	return 0;
}